

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O0

void __thiscall trackerboy::apu::WaveChannel::setVolume(WaveChannel *this,uint8_t volume)

{
  uint8_t volume_local;
  WaveChannel *this_local;
  
  this->mWaveVolume = volume;
  if (volume == '\0') {
    this->mVolumeShift = '\x04';
  }
  else if (volume == '\x01') {
    this->mVolumeShift = '\0';
  }
  else if (volume == '\x02') {
    this->mVolumeShift = '\x01';
  }
  else {
    this->mVolumeShift = '\x02';
  }
  updateOutput(this);
  return;
}

Assistant:

void WaveChannel::setVolume(uint8_t volume) noexcept {
    mWaveVolume = volume;
    switch (volume) {
        case VolumeMute:
            mVolumeShift = 4;
            break;
        case VolumeFull:
            mVolumeShift = 0;
            break;
        case VolumeHalf:
            mVolumeShift = 1;
            break;
        default:
            mVolumeShift = 2;
            break;
    }
    updateOutput();
}